

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::
GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
          (ConstantManager *this,Type *type,SmallVector<unsigned_int,_2UL> *literal_words_or_ids)

{
  const_iterator __first;
  const_iterator __last;
  Constant *pCVar1;
  allocator<unsigned_int> local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  SmallVector<unsigned_int,_2UL> *local_20;
  SmallVector<unsigned_int,_2UL> *literal_words_or_ids_local;
  Type *type_local;
  ConstantManager *this_local;
  
  local_20 = literal_words_or_ids;
  literal_words_or_ids_local = (SmallVector<unsigned_int,_2UL> *)type;
  type_local = (Type *)this;
  __first = utils::SmallVector<unsigned_int,_2UL>::begin(literal_words_or_ids);
  __last = utils::SmallVector<unsigned_int,_2UL>::end(local_20);
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,__first,__last,&local_39
            );
  pCVar1 = GetConstant(this,type,&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  std::allocator<unsigned_int>::~allocator(&local_39);
  return pCVar1;
}

Assistant:

const Constant* GetConstant(const Type* type, const C& literal_words_or_ids) {
    return GetConstant(type, std::vector<uint32_t>(literal_words_or_ids.begin(),
                                                   literal_words_or_ids.end()));
  }